

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_stats_striped_avx2_256_64.c
# Opt level: O2

parasail_result_t *
parasail_nw_stats_table_striped_profile_avx2_256_64
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  undefined1 (*pauVar1) [32];
  long *plVar2;
  __m256i alVar3;
  __m256i alVar4;
  __m256i alVar5;
  __m256i alVar6;
  void *pvVar7;
  parasail_matrix_t *ppVar8;
  void *pvVar9;
  void *pvVar10;
  ulong uVar11;
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  __m256i c;
  __m256i c_00;
  __m256i a;
  __m256i a_00;
  __m256i a_01;
  __m256i a_02;
  __m256i a_03;
  __m256i a_04;
  __m256i a_05;
  __m256i vH;
  __m256i vH_00;
  __m256i vH_01;
  __m256i vH_02;
  __m256i a_06;
  __m256i a_07;
  __m256i a_08;
  __m256i a_09;
  __m256i a_10;
  __m256i a_11;
  __m256i a_12;
  __m256i a_13;
  __m256i vH_03;
  __m256i vH_04;
  __m256i vH_05;
  __m256i vH_06;
  __m256i b;
  __m256i b_00;
  __m256i b_01;
  __m256i b_02;
  __m256i b_03;
  __m256i b_04;
  __m256i b_05;
  __m256i b_06;
  __m256i b_07;
  __m256i b_08;
  __m256i b_09;
  __m256i b_10;
  __m256i b_11;
  __m256i b_12;
  __m256i b_13;
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  int iVar18;
  uint uVar19;
  int iVar20;
  parasail_result_t *ppVar21;
  __m256i *ptr;
  __m256i *palVar22;
  __m256i *b_14;
  __m256i *palVar23;
  __m256i *palVar24;
  __m256i *ptr_00;
  __m256i *palVar25;
  __m256i *ptr_01;
  __m256i *ptr_02;
  __m256i *b_15;
  __m256i *b_16;
  __m256i *b_17;
  int64_t *ptr_03;
  long lVar26;
  long lVar27;
  undefined8 uVar28;
  long lVar29;
  __m256i *ptr_04;
  char *pcVar30;
  int iVar31;
  ulong uVar32;
  __m256i *ptr_05;
  uint uVar33;
  ulong uVar34;
  int iVar35;
  ulong uVar36;
  char *__format;
  long lVar37;
  long lVar38;
  long lVar39;
  __m256i *ptr_06;
  int iVar40;
  int32_t d;
  int32_t iVar41;
  ulong size;
  undefined1 auVar42 [16];
  undefined1 auVar46 [16];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar51 [16];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [32];
  undefined1 auVar55 [16];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [64];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [64];
  __m256i_64_t e;
  __m256i_64_t h;
  undefined1 in_stack_fffffffffffffba0 [24];
  __m256i *palVar63;
  __m256i *palVar64;
  long local_3a0;
  long lStack_398;
  long lStack_388;
  long local_380;
  long lStack_378;
  long lStack_368;
  undefined1 local_340 [32];
  long local_320;
  long lStack_318;
  long lStack_308;
  long local_200;
  long lStack_1f8;
  long lStack_1f0;
  long lStack_1e8;
  long local_1e0;
  long lStack_1d8;
  long lStack_1d0;
  long lStack_1c8;
  longlong local_a0 [4];
  longlong local_80 [10];
  
  if (profile == (parasail_profile_t *)0x0) {
    __format = "%s: missing %s\n";
    pcVar30 = "profile";
  }
  else {
    pvVar7 = (profile->profile64).score;
    if (pvVar7 == (void *)0x0) {
      __format = "%s: missing %s\n";
      pcVar30 = "profile->profile64.score";
    }
    else {
      ppVar8 = profile->matrix;
      if (ppVar8 == (parasail_matrix_t *)0x0) {
        __format = "%s: missing %s\n";
        pcVar30 = "profile->matrix";
      }
      else {
        uVar19 = profile->s1Len;
        if ((int)uVar19 < 1) {
          __format = "%s: %s must be > 0\n";
          pcVar30 = "profile->s1Len";
        }
        else if (s2 == (char *)0x0) {
          __format = "%s: missing %s\n";
          pcVar30 = "s2";
        }
        else if (s2Len < 1) {
          __format = "%s: %s must be > 0\n";
          pcVar30 = "s2Len";
        }
        else if (open < 0) {
          __format = "%s: %s must be >= 0\n";
          pcVar30 = "open";
        }
        else {
          if (-1 < gap) {
            uVar33 = uVar19 - 1;
            size = (ulong)uVar19 + 3 >> 2;
            uVar11 = (ulong)uVar33 % size;
            uVar32 = CONCAT44(0,open);
            iVar40 = -open;
            iVar20 = ppVar8->min;
            pvVar9 = (profile->profile64).matches;
            pvVar10 = (profile->profile64).similar;
            uVar36 = 0x8000000000000000 - (long)iVar20;
            if (iVar20 != iVar40 && SBORROW4(iVar20,iVar40) == iVar20 + open < 0) {
              uVar36 = uVar32 | 0x8000000000000000;
            }
            iVar20 = ppVar8->max;
            ppVar21 = parasail_result_new_table3((uint)((ulong)uVar19 + 3) & 0x7ffffffc,s2Len);
            if (ppVar21 != (parasail_result_t *)0x0) {
              ppVar21->flag = ppVar21->flag | 0x4830801;
              ptr = parasail_memalign___m256i(0x20,size);
              palVar22 = parasail_memalign___m256i(0x20,size);
              b_14 = parasail_memalign___m256i(0x20,size);
              palVar23 = parasail_memalign___m256i(0x20,size);
              palVar24 = parasail_memalign___m256i(0x20,size);
              ptr_00 = parasail_memalign___m256i(0x20,size);
              palVar25 = parasail_memalign___m256i(0x20,size);
              ptr_01 = parasail_memalign___m256i(0x20,size);
              ptr_02 = parasail_memalign___m256i(0x20,size);
              b_15 = parasail_memalign___m256i(0x20,size);
              b_16 = parasail_memalign___m256i(0x20,size);
              b_17 = parasail_memalign___m256i(0x20,size);
              ptr_03 = parasail_memalign_int64_t(0x20,(ulong)(s2Len + 1));
              auVar48._8_8_ = 0;
              auVar48._0_8_ = ptr;
              auVar51._8_8_ = 0;
              auVar51._0_8_ = palVar22;
              auVar48 = vpunpcklqdq_avx(auVar48,auVar51);
              auVar42._8_8_ = 0;
              auVar42._0_8_ = b_14;
              auVar46._8_8_ = 0;
              auVar46._0_8_ = palVar23;
              auVar51 = vpunpcklqdq_avx(auVar42,auVar46);
              auVar42 = ZEXT116(0) * auVar51 + ZEXT116(1) * auVar48;
              auVar46 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar51;
              auVar47._8_8_ = 0;
              auVar47._0_8_ = palVar24;
              auVar52._8_8_ = 0;
              auVar52._0_8_ = ptr_00;
              auVar48 = vpunpcklqdq_avx(auVar47,auVar52);
              auVar53._8_8_ = 0;
              auVar53._0_8_ = palVar25;
              auVar55._8_8_ = 0;
              auVar55._0_8_ = ptr_01;
              auVar51 = vpunpcklqdq_avx(auVar53,auVar55);
              auVar48 = ZEXT116(0) * auVar51 + ZEXT116(1) * auVar48;
              auVar51 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar51;
              auVar43._0_8_ = -(ulong)(auVar42._0_8_ == 0);
              auVar43._8_8_ = -(ulong)(auVar42._8_8_ == 0);
              auVar43._16_8_ = -(ulong)(auVar46._0_8_ == 0);
              auVar43._24_8_ = -(ulong)(auVar46._8_8_ == 0);
              auVar49._0_8_ = -(ulong)(auVar48._0_8_ == 0);
              auVar49._8_8_ = -(ulong)(auVar48._8_8_ == 0);
              auVar49._16_8_ = -(ulong)(auVar51._0_8_ == 0);
              auVar49._24_8_ = -(ulong)(auVar51._8_8_ == 0);
              auVar43 = vpackssdw_avx2(auVar43,auVar49);
              if (((((b_15 != (__m256i *)0x0 && ptr_02 != (__m256i *)0x0) && b_16 != (__m256i *)0x0)
                   && b_17 != (__m256i *)0x0) && ptr_03 != (int64_t *)0x0) &&
                  ((((((((auVar43 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                        (auVar43 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       (auVar43 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      SUB321(auVar43 >> 0x7f,0) == '\0') &&
                     (auVar43 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    SUB321(auVar43 >> 0xbf,0) == '\0') &&
                   (auVar43 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar43[0x1f])) {
                iVar18 = s2Len + -1;
                uVar34 = CONCAT44(0,gap);
                auVar44._8_4_ = gap;
                auVar44._0_8_ = uVar34;
                auVar44._12_4_ = 0;
                auVar44._16_4_ = gap;
                auVar44._20_4_ = 0;
                auVar44._24_4_ = gap;
                auVar44._28_4_ = 0;
                lVar29 = uVar36 + 1;
                lVar26 = 0x7ffffffffffffffe - (long)iVar20;
                alVar3[3] = (longlong)ptr;
                alVar3[0] = in_stack_fffffffffffffba0._0_8_;
                alVar3[1] = in_stack_fffffffffffffba0._8_8_;
                alVar3[2] = in_stack_fffffffffffffba0._16_8_;
                ptr_05 = palVar24;
                parasail_memset___m256i(b_14,alVar3,size);
                alVar4[3] = (longlong)ptr;
                alVar4[0] = in_stack_fffffffffffffba0._0_8_;
                alVar4[1] = in_stack_fffffffffffffba0._8_8_;
                alVar4[2] = in_stack_fffffffffffffba0._16_8_;
                parasail_memset___m256i(palVar24,alVar4,size);
                alVar5[3] = (longlong)ptr;
                alVar5[0] = in_stack_fffffffffffffba0._0_8_;
                alVar5[1] = in_stack_fffffffffffffba0._8_8_;
                alVar5[2] = in_stack_fffffffffffffba0._16_8_;
                parasail_memset___m256i(palVar25,alVar5,size);
                alVar6[3] = (longlong)ptr;
                alVar6[0] = in_stack_fffffffffffffba0._0_8_;
                alVar6[1] = in_stack_fffffffffffffba0._8_8_;
                alVar6[2] = in_stack_fffffffffffffba0._16_8_;
                parasail_memset___m256i(b_15,alVar6,size);
                c[3] = (longlong)ptr;
                c[0] = in_stack_fffffffffffffba0._0_8_;
                c[1] = in_stack_fffffffffffffba0._8_8_;
                c[2] = in_stack_fffffffffffffba0._16_8_;
                parasail_memset___m256i(b_16,c,size);
                c_00[3] = (longlong)ptr;
                c_00[0] = in_stack_fffffffffffffba0._0_8_;
                c_00[1] = in_stack_fffffffffffffba0._8_8_;
                c_00[2] = in_stack_fffffffffffffba0._16_8_;
                parasail_memset___m256i(b_17,c_00,size);
                lVar27 = (long)iVar40;
                lVar37 = lVar27;
                for (uVar36 = 0; uVar36 != size; uVar36 = uVar36 + 1) {
                  lVar38 = lVar37;
                  for (lVar39 = 0; lVar39 != 4; lVar39 = lVar39 + 1) {
                    local_80[lVar39] = lVar38;
                    local_a0[lVar39] = lVar38 - uVar32;
                    lVar38 = lVar38 - size * uVar34;
                  }
                  palVar24 = ptr + uVar36;
                  (*palVar24)[0] = local_80[0];
                  (*palVar24)[1] = local_80[1];
                  (*palVar24)[2] = local_80[2];
                  (*palVar24)[3] = local_80[3];
                  palVar24 = ptr_02 + uVar36;
                  (*palVar24)[0] = local_a0[0];
                  (*palVar24)[1] = local_a0[1];
                  (*palVar24)[2] = local_a0[2];
                  (*palVar24)[3] = local_a0[3];
                  lVar37 = lVar37 - uVar34;
                }
                *ptr_03 = 0;
                for (uVar36 = 1; s2Len + 1 != uVar36; uVar36 = uVar36 + 1) {
                  ptr_03[uVar36] = lVar27;
                  lVar27 = lVar27 - uVar34;
                }
                iVar20 = (int)size;
                uVar19 = iVar20 - 1;
                palVar24 = (__m256i *)0x0;
                local_200 = lVar29;
                lStack_1f8 = lVar29;
                lStack_1f0 = lVar29;
                lStack_1e8 = lVar29;
                local_1e0 = lVar26;
                lStack_1d8 = lVar26;
                lStack_1d0 = lVar26;
                lStack_1c8 = lVar26;
                do {
                  ptr_06 = palVar23;
                  ptr_04 = palVar22;
                  if (palVar24 == (__m256i *)(ulong)(uint)s2Len) {
                    alVar3 = ptr[uVar11];
                    alVar4 = b_14[uVar11];
                    alVar5 = ptr_05[uVar11];
                    alVar6 = palVar25[uVar11];
                    for (iVar20 = 0; iVar20 < 3 - (int)(uVar33 / size); iVar20 = iVar20 + 1) {
                      auVar43 = vperm2i128_avx2((undefined1  [32])alVar3,(undefined1  [32])alVar3,8)
                      ;
                      alVar3 = (__m256i)vpalignr_avx2((undefined1  [32])alVar3,auVar43,8);
                      auVar43 = vperm2i128_avx2((undefined1  [32])alVar4,(undefined1  [32])alVar4,8)
                      ;
                      alVar4 = (__m256i)vpalignr_avx2((undefined1  [32])alVar4,auVar43,8);
                      auVar43 = vperm2i128_avx2((undefined1  [32])alVar5,(undefined1  [32])alVar5,8)
                      ;
                      alVar5 = (__m256i)vpalignr_avx2((undefined1  [32])alVar5,auVar43,8);
                      auVar43 = vperm2i128_avx2((undefined1  [32])alVar6,(undefined1  [32])alVar6,8)
                      ;
                      alVar6 = (__m256i)vpalignr_avx2((undefined1  [32])alVar6,auVar43,8);
                    }
                    auVar17._8_8_ = lVar29;
                    auVar17._0_8_ = lVar29;
                    auVar17._16_8_ = lVar29;
                    auVar17._24_8_ = lVar29;
                    auVar16._8_8_ = lStack_1d8;
                    auVar16._0_8_ = local_1e0;
                    auVar16._16_8_ = lStack_1d0;
                    auVar16._24_8_ = lStack_1c8;
                    auVar43 = vpcmpgtq_avx2(auVar17,auVar16);
                    auVar14._8_8_ = lStack_1f8;
                    auVar14._0_8_ = local_200;
                    auVar14._16_8_ = lStack_1f0;
                    auVar14._24_8_ = lStack_1e8;
                    auVar45._8_8_ = lVar26;
                    auVar45._0_8_ = lVar26;
                    auVar45._16_8_ = lVar26;
                    auVar45._24_8_ = lVar26;
                    auVar49 = vpcmpgtq_avx2(auVar14,auVar45);
                    auVar43 = vpor_avx2(auVar49,auVar43);
                    if ((((auVar43 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         SUB321(auVar43 >> 0x7f,0) == '\0') && SUB321(auVar43 >> 0xbf,0) == '\0') &&
                        -1 < auVar43[0x1f]) {
                      uVar28 = vpextrq_avx(alVar3._16_16_,1);
                      iVar20 = (int)uVar28;
                      uVar28 = vpextrq_avx(alVar4._16_16_,1);
                      iVar40 = (int)uVar28;
                      uVar28 = vpextrq_avx(alVar5._16_16_,1);
                      iVar31 = (int)uVar28;
                      uVar28 = vpextrq_avx(alVar6._16_16_,1);
                      iVar35 = (int)uVar28;
                    }
                    else {
                      *(byte *)&ppVar21->flag = (byte)ppVar21->flag | 0x40;
                      iVar20 = 0;
                      iVar40 = 0;
                      iVar31 = 0;
                      iVar35 = 0;
                      iVar18 = 0;
                      uVar33 = 0;
                    }
                    ppVar21->score = iVar20;
                    ppVar21->end_query = uVar33;
                    ppVar21->end_ref = iVar18;
                    ((ppVar21->field_4).stats)->matches = iVar40;
                    ((ppVar21->field_4).stats)->similar = iVar31;
                    ((ppVar21->field_4).stats)->length = iVar35;
                    parasail_free(ptr_03);
                    parasail_free(b_17);
                    parasail_free(b_16);
                    parasail_free(b_15);
                    parasail_free(ptr_02);
                    parasail_free(ptr_01);
                    parasail_free(palVar25);
                    parasail_free(ptr_00);
                    parasail_free(ptr_05);
                    parasail_free(ptr_06);
                    parasail_free(b_14);
                    parasail_free(ptr_04);
                    parasail_free(ptr);
                    return ppVar21;
                  }
                  palVar22 = ptr + uVar19;
                  alVar3 = ptr[uVar19];
                  alVar4 = b_14[uVar19];
                  alVar5 = ptr_05[uVar19];
                  alVar6 = palVar25[uVar19];
                  auVar48 = alVar3._0_16_;
                  auVar58._0_16_ = ZEXT116(0) * auVar48 + ZEXT116(1) * auVar48;
                  auVar58._16_16_ = ZEXT116(0) * alVar3._16_16_ + ZEXT116(1) * auVar48;
                  auVar43 = vpalignr_avx2((undefined1  [32])alVar3,auVar58,8);
                  auVar49 = vperm2i128_avx2((undefined1  [32])alVar4,(undefined1  [32])alVar4,8);
                  auVar49 = vpalignr_avx2((undefined1  [32])alVar4,auVar49,8);
                  auVar58 = vperm2i128_avx2((undefined1  [32])alVar5,(undefined1  [32])alVar5,8);
                  auVar58 = vpalignr_avx2((undefined1  [32])alVar5,auVar58,8);
                  auVar15 = vperm2i128_avx2((undefined1  [32])alVar6,(undefined1  [32])alVar6,8);
                  auVar15 = vpalignr_avx2((undefined1  [32])alVar6,auVar15,8);
                  auVar43 = vpblendd_avx2(auVar43,ZEXT832((ulong)ptr_03[(long)palVar24]),3);
                  lVar37 = (long)(ppVar8->mapper[(byte)s2[(long)palVar24]] * iVar20) * 0x20;
                  auVar59 = ZEXT1664((undefined1  [16])0x0);
                  iVar41 = 0;
                  auVar61._8_8_ = lVar29;
                  auVar61._0_8_ = lVar29;
                  auVar61._16_8_ = lVar29;
                  auVar61._24_8_ = lVar29;
                  auVar62 = ZEXT1664((undefined1  [16])0x0);
                  auVar12._8_8_ = 1;
                  auVar12._0_8_ = 1;
                  auVar12._16_8_ = 1;
                  auVar12._24_8_ = 1;
                  palVar23 = palVar24;
                  palVar63 = palVar25;
                  palVar64 = ptr_05;
                  for (lVar27 = 0; d = (int32_t)palVar24, size << 5 != lVar27;
                      lVar27 = lVar27 + 0x20) {
                    auVar13 = *(undefined1 (*) [32])((long)*ptr_02 + lVar27);
                    pauVar1 = (undefined1 (*) [32])((long)*b_15 + lVar27);
                    auVar14 = *pauVar1;
                    auVar50 = *pauVar1;
                    pauVar1 = (undefined1 (*) [32])((long)*b_16 + lVar27);
                    auVar16 = *pauVar1;
                    auVar54 = *pauVar1;
                    pauVar1 = (undefined1 (*) [32])((long)*b_17 + lVar27);
                    auVar17 = *pauVar1;
                    auVar56 = *pauVar1;
                    auVar43 = vpaddq_avx2(auVar43,*(undefined1 (*) [32])
                                                   ((long)pvVar7 + lVar27 + lVar37));
                    a[3] = (longlong)ptr;
                    a[0] = in_stack_fffffffffffffba0._0_8_;
                    a[1] = in_stack_fffffffffffffba0._8_8_;
                    a[2] = in_stack_fffffffffffffba0._16_8_;
                    b[1] = (longlong)ptr_03;
                    b[0] = (longlong)palVar63;
                    b[2] = (longlong)palVar64;
                    b[3] = (longlong)b_14;
                    auVar45 = auVar43;
                    _mm256_max_epi64_rpl(palVar23,a,b);
                    a_00[3] = (longlong)ptr;
                    a_00[0] = in_stack_fffffffffffffba0._0_8_;
                    a_00[1] = in_stack_fffffffffffffba0._8_8_;
                    a_00[2] = in_stack_fffffffffffffba0._16_8_;
                    b_00[1] = (longlong)ptr_03;
                    b_00[0] = (longlong)palVar63;
                    b_00[2] = (longlong)palVar64;
                    b_00[3] = (longlong)b_14;
                    _mm256_max_epi64_rpl(palVar23,a_00,b_00);
                    *(undefined1 (*) [32])((long)*ptr_04 + lVar27) = auVar45;
                    local_380 = auVar43._0_8_;
                    auVar57._0_8_ = -(ulong)(auVar45._0_8_ == local_380);
                    lStack_378 = auVar43._8_8_;
                    auVar57._8_8_ = -(ulong)(auVar45._8_8_ == lStack_378);
                    auVar57._16_8_ = -(ulong)(auVar45._16_8_ == auVar43._16_8_);
                    lStack_368 = auVar43._24_8_;
                    auVar57._24_8_ = -(ulong)(auVar45._24_8_ == lStack_368);
                    local_320 = auVar61._0_8_;
                    auVar60._0_8_ = -(ulong)(auVar45._0_8_ == local_320);
                    lStack_318 = auVar61._8_8_;
                    auVar60._8_8_ = -(ulong)(auVar45._8_8_ == lStack_318);
                    auVar60._16_8_ = -(ulong)(auVar45._16_8_ == auVar61._16_8_);
                    lStack_308 = auVar61._24_8_;
                    auVar60._24_8_ = -(ulong)(auVar45._24_8_ == lStack_308);
                    auVar43 = vblendvpd_avx(auVar50,auVar59._0_32_,auVar60);
                    auVar49 = vpaddq_avx2(auVar49,*(undefined1 (*) [32])
                                                   ((long)pvVar9 + lVar27 + lVar37));
                    auVar43 = vblendvpd_avx(auVar43,auVar49,auVar57);
                    *(undefined1 (*) [32])((long)*ptr_06 + lVar27) = auVar43;
                    auVar49 = vblendvpd_avx(auVar54,auVar62._0_32_,auVar60);
                    auVar58 = vpaddq_avx2(auVar58,*(undefined1 (*) [32])
                                                   ((long)pvVar10 + lVar27 + lVar37));
                    auVar49 = vblendvpd_avx(auVar49,auVar58,auVar57);
                    *(undefined1 (*) [32])((long)*ptr_00 + lVar27) = auVar49;
                    auVar58 = vblendvpd_avx(auVar56,auVar12,auVar60);
                    auVar50 = vpcmpeqd_avx2(auVar56,auVar56);
                    auVar15 = vpsubq_avx2(auVar15,auVar50);
                    auVar58 = vblendvpd_avx(auVar58,auVar15,auVar57);
                    *(undefined1 (*) [32])((long)*ptr_01 + lVar27) = auVar58;
                    a_01[3] = (longlong)ptr;
                    a_01[0] = in_stack_fffffffffffffba0._0_8_;
                    a_01[1] = in_stack_fffffffffffffba0._8_8_;
                    a_01[2] = in_stack_fffffffffffffba0._16_8_;
                    b_01[1] = (longlong)ptr_03;
                    b_01[0] = (longlong)palVar63;
                    b_01[2] = (longlong)palVar64;
                    b_01[3] = (longlong)b_14;
                    _mm256_min_epi64_rpl(palVar23,a_01,b_01);
                    a_02[3] = (longlong)ptr;
                    a_02[0] = in_stack_fffffffffffffba0._0_8_;
                    a_02[1] = in_stack_fffffffffffffba0._8_8_;
                    a_02[2] = in_stack_fffffffffffffba0._16_8_;
                    b_02[1] = (longlong)ptr_03;
                    b_02[0] = (longlong)palVar63;
                    b_02[2] = (longlong)palVar64;
                    b_02[3] = (longlong)b_14;
                    _mm256_max_epi64_rpl(palVar23,a_02,b_02);
                    a_03[3] = (longlong)ptr;
                    a_03[0] = in_stack_fffffffffffffba0._0_8_;
                    a_03[1] = in_stack_fffffffffffffba0._8_8_;
                    a_03[2] = in_stack_fffffffffffffba0._16_8_;
                    b_03[1] = (longlong)ptr_03;
                    b_03[0] = (longlong)palVar63;
                    b_03[2] = (longlong)palVar64;
                    b_03[3] = (longlong)b_14;
                    _mm256_max_epi64_rpl(palVar23,a_03,b_03);
                    a_04[3] = (longlong)ptr;
                    a_04[0] = in_stack_fffffffffffffba0._0_8_;
                    a_04[1] = in_stack_fffffffffffffba0._8_8_;
                    a_04[2] = in_stack_fffffffffffffba0._16_8_;
                    b_04[1] = (longlong)ptr_03;
                    b_04[0] = (longlong)palVar63;
                    b_04[2] = (longlong)palVar64;
                    b_04[3] = (longlong)b_14;
                    _mm256_max_epi64_rpl(palVar23,a_04,b_04);
                    a_05[3] = (longlong)ptr;
                    a_05[0] = in_stack_fffffffffffffba0._0_8_;
                    a_05[1] = in_stack_fffffffffffffba0._8_8_;
                    a_05[2] = in_stack_fffffffffffffba0._16_8_;
                    b_05[1] = (longlong)ptr_03;
                    b_05[0] = (longlong)palVar63;
                    b_05[2] = (longlong)palVar64;
                    b_05[3] = (longlong)b_14;
                    _mm256_max_epi64_rpl(palVar23,a_05,b_05);
                    vH[3] = (longlong)ptr;
                    vH[0] = in_stack_fffffffffffffba0._0_8_;
                    vH[1] = in_stack_fffffffffffffba0._8_8_;
                    vH[2] = in_stack_fffffffffffffba0._16_8_;
                    arr_store_si256(*(int **)((long)((ppVar21->field_4).trace)->trace_del_table + 8)
                                    ,vH,iVar41,iVar20,d,s2Len);
                    vH_00[3] = (longlong)ptr;
                    vH_00[0] = in_stack_fffffffffffffba0._0_8_;
                    vH_00[1] = in_stack_fffffffffffffba0._8_8_;
                    vH_00[2] = in_stack_fffffffffffffba0._16_8_;
                    arr_store_si256(*(int **)((long)((ppVar21->field_4).trace)->trace_del_table +
                                             0x10),vH_00,iVar41,iVar20,d,s2Len);
                    vH_01[3] = (longlong)ptr;
                    vH_01[0] = in_stack_fffffffffffffba0._0_8_;
                    vH_01[1] = in_stack_fffffffffffffba0._8_8_;
                    vH_01[2] = in_stack_fffffffffffffba0._16_8_;
                    arr_store_si256(*(int **)((long)((ppVar21->field_4).trace)->trace_del_table +
                                             0x18),vH_01,iVar41,iVar20,d,s2Len);
                    palVar23 = *((ppVar21->field_4).trace)->trace_del_table;
                    vH_02[3] = (longlong)ptr;
                    vH_02[0] = in_stack_fffffffffffffba0._0_8_;
                    vH_02[1] = in_stack_fffffffffffffba0._8_8_;
                    vH_02[2] = in_stack_fffffffffffffba0._16_8_;
                    arr_store_si256((int *)palVar23,vH_02,iVar41,iVar20,d,s2Len);
                    auVar15._8_4_ = open;
                    auVar15._0_8_ = uVar32;
                    auVar15._12_4_ = 0;
                    auVar15._16_4_ = open;
                    auVar15._20_4_ = 0;
                    auVar15._24_4_ = open;
                    auVar15._28_4_ = 0;
                    auVar56 = vpsubq_avx2(auVar45,auVar15);
                    auVar15 = vpsubq_avx2(auVar13,auVar44);
                    a_06[3] = (longlong)ptr;
                    a_06[0] = in_stack_fffffffffffffba0._0_8_;
                    a_06[1] = in_stack_fffffffffffffba0._8_8_;
                    a_06[2] = in_stack_fffffffffffffba0._16_8_;
                    b_06[1] = (longlong)ptr_03;
                    b_06[0] = (longlong)palVar63;
                    b_06[2] = (longlong)palVar64;
                    b_06[3] = (longlong)b_14;
                    auVar45 = auVar56;
                    _mm256_max_epi64_rpl(palVar23,a_06,b_06);
                    auVar54 = vpcmpgtq_avx2(auVar56,auVar15);
                    auVar15 = vblendvpd_avx(auVar14,auVar43,auVar54);
                    auVar50 = vblendvpd_avx(auVar16,auVar49,auVar54);
                    auVar13 = vpcmpeqd_avx2(auVar60,auVar60);
                    auVar14 = vpsubq_avx2(auVar17,auVar13);
                    auVar13 = vpsubq_avx2(auVar58,auVar13);
                    auVar58 = vblendvpd_avx(auVar14,auVar13,auVar54);
                    *(undefined1 (*) [32])((long)*ptr_02 + lVar27) = auVar45;
                    *(undefined1 (*) [32])((long)*b_15 + lVar27) = auVar15;
                    *(undefined1 (*) [32])((long)*b_16 + lVar27) = auVar50;
                    *(undefined1 (*) [32])((long)*b_17 + lVar27) = auVar58;
                    auVar58 = vpsubq_avx2(auVar61,auVar44);
                    a_07[3] = (longlong)ptr;
                    a_07[0] = in_stack_fffffffffffffba0._0_8_;
                    a_07[1] = in_stack_fffffffffffffba0._8_8_;
                    a_07[2] = in_stack_fffffffffffffba0._16_8_;
                    b_07[1] = (longlong)ptr_03;
                    b_07[0] = (longlong)palVar63;
                    b_07[2] = (longlong)palVar64;
                    b_07[3] = (longlong)b_14;
                    auVar61 = auVar56;
                    _mm256_max_epi64_rpl(palVar23,a_07,b_07);
                    auVar58 = vpcmpgtq_avx2(auVar56,auVar58);
                    auVar43 = vblendvpd_avx(auVar59._0_32_,auVar43,auVar58);
                    auVar59 = ZEXT3264(auVar43);
                    auVar43 = vblendvpd_avx(auVar62._0_32_,auVar49,auVar58);
                    auVar62 = ZEXT3264(auVar43);
                    auVar43 = vpsubq_avx2(auVar12,_DAT_008a5a80);
                    auVar12 = vblendvpd_avx(auVar43,auVar13,auVar58);
                    auVar43 = *(undefined1 (*) [32])((long)*ptr + lVar27);
                    auVar49 = *(undefined1 (*) [32])((long)*b_14 + lVar27);
                    auVar58 = *(undefined1 (*) [32])((long)*palVar64 + lVar27);
                    auVar15 = *(undefined1 (*) [32])((long)*palVar63 + lVar27);
                    iVar41 = iVar41 + 1;
                  }
                  for (iVar40 = 0; iVar40 != 4; iVar40 = iVar40 + 1) {
                    alVar3 = *palVar22;
                    auVar48 = alVar3._0_16_;
                    auVar50._0_16_ = ZEXT116(0) * auVar48 + ZEXT116(1) * auVar48;
                    auVar50._16_16_ = ZEXT116(0) * alVar3._16_16_ + ZEXT116(1) * auVar48;
                    auVar43 = vpalignr_avx2((undefined1  [32])alVar3,auVar50,8);
                    auVar15 = vpermq_avx2(auVar61,0x90);
                    auVar58 = auVar59._0_32_;
                    auVar49 = vperm2i128_avx2(auVar58,auVar58,8);
                    auVar49 = vpalignr_avx2(auVar58,auVar49,8);
                    auVar61 = auVar62._0_32_;
                    auVar58 = vperm2i128_avx2(auVar61,auVar61,8);
                    auVar58 = vpalignr_avx2(auVar61,auVar58,8);
                    auVar12 = vpermq_avx2(auVar12,0x90);
                    auVar43 = vpblendd_avx2(auVar43,ZEXT832((ulong)ptr_03[(long)palVar24]),3);
                    auVar61 = vpblendd_avx2(auVar15,ZEXT832(ptr_03[(long)((long)*palVar24 + 1)] -
                                                            uVar32),3);
                    auVar12 = vpblendd_avx2(auVar12,ZEXT832(1),3);
                    lVar27 = 0;
                    uVar36 = 0;
                    palVar25 = palVar24;
                    while( true ) {
                      auVar62 = ZEXT3264(auVar58);
                      auVar59 = ZEXT3264(auVar49);
                      if (size == uVar36) break;
                      auVar43 = vpaddq_avx2(auVar43,*(undefined1 (*) [32])
                                                     ((long)pvVar7 + lVar27 + lVar37));
                      plVar2 = (long *)((long)*ptr_04 + lVar27);
                      local_340._0_8_ = *plVar2;
                      local_340._8_8_ = plVar2[1];
                      local_340._16_8_ = plVar2[2];
                      local_340._24_8_ = plVar2[3];
                      a_08[3] = (longlong)ptr;
                      a_08[0] = in_stack_fffffffffffffba0._0_8_;
                      a_08[1] = in_stack_fffffffffffffba0._8_8_;
                      a_08[2] = in_stack_fffffffffffffba0._16_8_;
                      b_08[1] = (longlong)ptr_03;
                      b_08[0] = (longlong)palVar63;
                      b_08[2] = (longlong)palVar64;
                      b_08[3] = (longlong)b_14;
                      _mm256_max_epi64_rpl(palVar25,a_08,b_08);
                      plVar2 = (long *)((long)*ptr_04 + lVar27);
                      *plVar2 = local_340._0_8_;
                      plVar2[1] = local_340._8_8_;
                      plVar2[2] = local_340._16_8_;
                      plVar2[3] = local_340._24_8_;
                      local_320 = auVar61._0_8_;
                      auVar54._0_8_ = -(ulong)(local_340._0_8_ == local_320);
                      lStack_318 = auVar61._8_8_;
                      auVar54._8_8_ = -(ulong)(local_340._8_8_ == lStack_318);
                      auVar54._16_8_ = -(ulong)(local_340._16_8_ == auVar61._16_8_);
                      lStack_308 = auVar61._24_8_;
                      auVar54._24_8_ = -(ulong)(local_340._24_8_ == lStack_308);
                      local_3a0 = auVar43._0_8_;
                      auVar56._0_8_ = -(ulong)(local_340._0_8_ == local_3a0);
                      lStack_398 = auVar43._8_8_;
                      auVar56._8_8_ = -(ulong)(local_340._8_8_ == lStack_398);
                      auVar56._16_8_ = -(ulong)(local_340._16_8_ == auVar43._16_8_);
                      lStack_388 = auVar43._24_8_;
                      auVar56._24_8_ = -(ulong)(local_340._24_8_ == lStack_388);
                      auVar50 = vpandn_avx2(auVar56,auVar54);
                      auVar43 = vblendvpd_avx(*(undefined1 (*) [32])((long)*ptr_06 + lVar27),auVar49
                                              ,auVar50);
                      *(undefined1 (*) [32])((long)*ptr_06 + lVar27) = auVar43;
                      auVar15 = vblendvpd_avx(*(undefined1 (*) [32])((long)*ptr_00 + lVar27),auVar58
                                              ,auVar50);
                      *(undefined1 (*) [32])((long)*ptr_00 + lVar27) = auVar15;
                      auVar50 = vblendvpd_avx(*(undefined1 (*) [32])((long)*ptr_01 + lVar27),auVar12
                                              ,auVar50);
                      *(undefined1 (*) [32])((long)*ptr_01 + lVar27) = auVar50;
                      a_09[3] = (longlong)ptr;
                      a_09[0] = in_stack_fffffffffffffba0._0_8_;
                      a_09[1] = in_stack_fffffffffffffba0._8_8_;
                      a_09[2] = in_stack_fffffffffffffba0._16_8_;
                      b_09[1] = (longlong)ptr_03;
                      b_09[0] = (longlong)palVar63;
                      b_09[2] = (longlong)palVar64;
                      b_09[3] = (longlong)b_14;
                      _mm256_min_epi64_rpl(palVar25,a_09,b_09);
                      a_10[3] = (longlong)ptr;
                      a_10[0] = in_stack_fffffffffffffba0._0_8_;
                      a_10[1] = in_stack_fffffffffffffba0._8_8_;
                      a_10[2] = in_stack_fffffffffffffba0._16_8_;
                      b_10[1] = (longlong)ptr_03;
                      b_10[0] = (longlong)palVar63;
                      b_10[2] = (longlong)palVar64;
                      b_10[3] = (longlong)b_14;
                      _mm256_max_epi64_rpl(palVar25,a_10,b_10);
                      a_11[3] = (longlong)ptr;
                      a_11[0] = in_stack_fffffffffffffba0._0_8_;
                      a_11[1] = in_stack_fffffffffffffba0._8_8_;
                      a_11[2] = in_stack_fffffffffffffba0._16_8_;
                      b_11[1] = (longlong)ptr_03;
                      b_11[0] = (longlong)palVar63;
                      b_11[2] = (longlong)palVar64;
                      b_11[3] = (longlong)b_14;
                      _mm256_max_epi64_rpl(palVar25,a_11,b_11);
                      a_12[3] = (longlong)ptr;
                      a_12[0] = in_stack_fffffffffffffba0._0_8_;
                      a_12[1] = in_stack_fffffffffffffba0._8_8_;
                      a_12[2] = in_stack_fffffffffffffba0._16_8_;
                      b_12[1] = (longlong)ptr_03;
                      b_12[0] = (longlong)palVar63;
                      b_12[2] = (longlong)palVar64;
                      b_12[3] = (longlong)b_14;
                      _mm256_max_epi64_rpl(palVar25,a_12,b_12);
                      a_13[3] = (longlong)ptr;
                      a_13[0] = in_stack_fffffffffffffba0._0_8_;
                      a_13[1] = in_stack_fffffffffffffba0._8_8_;
                      a_13[2] = in_stack_fffffffffffffba0._16_8_;
                      b_13[1] = (longlong)ptr_03;
                      b_13[0] = (longlong)palVar63;
                      b_13[2] = (longlong)palVar64;
                      b_13[3] = (longlong)b_14;
                      auVar54 = auVar50;
                      _mm256_max_epi64_rpl(palVar25,a_13,b_13);
                      vH_03[3] = (longlong)ptr;
                      vH_03[0] = in_stack_fffffffffffffba0._0_8_;
                      vH_03[1] = in_stack_fffffffffffffba0._8_8_;
                      vH_03[2] = in_stack_fffffffffffffba0._16_8_;
                      iVar41 = (int32_t)uVar36;
                      arr_store_si256(*(int **)((long)((ppVar21->field_4).trace)->trace_del_table +
                                               8),vH_03,iVar41,iVar20,d,s2Len);
                      vH_04[3] = (longlong)ptr;
                      vH_04[0] = in_stack_fffffffffffffba0._0_8_;
                      vH_04[1] = in_stack_fffffffffffffba0._8_8_;
                      vH_04[2] = in_stack_fffffffffffffba0._16_8_;
                      arr_store_si256(*(int **)((long)((ppVar21->field_4).trace)->trace_del_table +
                                               0x10),vH_04,iVar41,iVar20,d,s2Len);
                      vH_05[3] = (longlong)ptr;
                      vH_05[0] = in_stack_fffffffffffffba0._0_8_;
                      vH_05[1] = in_stack_fffffffffffffba0._8_8_;
                      vH_05[2] = in_stack_fffffffffffffba0._16_8_;
                      arr_store_si256(*(int **)((long)((ppVar21->field_4).trace)->trace_del_table +
                                               0x18),vH_05,iVar41,iVar20,d,s2Len);
                      palVar25 = *((ppVar21->field_4).trace)->trace_del_table;
                      vH_06[3] = (longlong)ptr;
                      vH_06[0] = in_stack_fffffffffffffba0._0_8_;
                      vH_06[1] = in_stack_fffffffffffffba0._8_8_;
                      vH_06[2] = in_stack_fffffffffffffba0._16_8_;
                      arr_store_si256((int *)palVar25,vH_06,iVar41,iVar20,d,s2Len);
                      auVar13._8_4_ = open;
                      auVar13._0_8_ = uVar32;
                      auVar13._12_4_ = 0;
                      auVar13._16_4_ = open;
                      auVar13._20_4_ = 0;
                      auVar13._24_4_ = open;
                      auVar13._28_4_ = 0;
                      auVar13 = vpsubq_avx2(local_340,auVar13);
                      auVar61 = vpsubq_avx2(auVar61,auVar44);
                      auVar56 = vpcmpgtq_avx2(auVar13,auVar61);
                      auVar54 = vpcmpeqd_avx2(auVar54,auVar54);
                      auVar13 = auVar54 & ~auVar56;
                      if ((((auVar13 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           SUB321(auVar13 >> 0x7f,0) == '\0') && SUB321(auVar13 >> 0xbf,0) == '\0')
                          && -1 < auVar13[0x1f]) goto LAB_00792f82;
                      auVar49 = vblendvpd_avx(auVar49,auVar43,auVar56);
                      auVar58 = vblendvpd_avx(auVar58,auVar15,auVar56);
                      auVar43 = vblendvpd_avx(auVar12,auVar50,auVar56);
                      auVar12 = vpsubq_avx2(auVar43,auVar54);
                      auVar43 = *(undefined1 (*) [32])((long)*ptr + lVar27);
                      uVar36 = uVar36 + 1;
                      lVar27 = lVar27 + 0x20;
                    }
                  }
LAB_00792f82:
                  palVar24 = (__m256i *)((long)*palVar24 + 1);
                  palVar22 = ptr;
                  ptr_05 = ptr_00;
                  palVar25 = ptr_01;
                  palVar23 = b_14;
                  ptr_01 = palVar63;
                  ptr_00 = palVar64;
                  b_14 = ptr_06;
                  ptr = ptr_04;
                } while( true );
              }
            }
            return (parasail_result_t *)0x0;
          }
          __format = "%s: %s must be >= 0\n";
          pcVar30 = "gap";
        }
      }
    }
  }
  fprintf(_stderr,__format,"parasail_nw_stats_table_striped_profile_avx2_256_64",pcVar30);
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m256i* restrict vProfile = NULL;
    __m256i* restrict vProfileM = NULL;
    __m256i* restrict vProfileS = NULL;
    __m256i* restrict pvHStore = NULL;
    __m256i* restrict pvHLoad = NULL;
    __m256i* restrict pvHMStore = NULL;
    __m256i* restrict pvHMLoad = NULL;
    __m256i* restrict pvHSStore = NULL;
    __m256i* restrict pvHSLoad = NULL;
    __m256i* restrict pvHLStore = NULL;
    __m256i* restrict pvHLLoad = NULL;
    __m256i* restrict pvE = NULL;
    __m256i* restrict pvEM = NULL;
    __m256i* restrict pvES = NULL;
    __m256i* restrict pvEL = NULL;
    int64_t* restrict boundary = NULL;
    __m256i vGapO;
    __m256i vGapE;
    int64_t NEG_LIMIT = 0;
    int64_t POS_LIMIT = 0;
    __m256i vZero;
    __m256i vOne;
    int64_t score = 0;
    int64_t matches = 0;
    int64_t similar = 0;
    int64_t length = 0;
    __m256i vNegLimit;
    __m256i vPosLimit;
    __m256i vSaturationCheckMin;
    __m256i vSaturationCheckMax;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile64.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 4; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    vProfile  = (__m256i*)profile->profile64.score;
    vProfileM = (__m256i*)profile->profile64.matches;
    vProfileS = (__m256i*)profile->profile64.similar;
    vGapO = _mm256_set1_epi64x_rpl(open);
    vGapE = _mm256_set1_epi64x_rpl(gap);
    NEG_LIMIT = (-open < matrix->min ? INT64_MIN + open : INT64_MIN - matrix->min) + 1;
    POS_LIMIT = INT64_MAX - matrix->max - 1;
    vZero = _mm256_setzero_si256();
    vOne = _mm256_set1_epi64x_rpl(1);
    score = NEG_LIMIT;
    matches = 0;
    similar = 0;
    length = 0;
    vNegLimit = _mm256_set1_epi64x_rpl(NEG_LIMIT);
    vPosLimit = _mm256_set1_epi64x_rpl(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table3(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol3(segLen*segWidth, s2Len);
#else
    result = parasail_result_new_stats();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_STATS
        | PARASAIL_FLAG_BITS_64 | PARASAIL_FLAG_LANES_4;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore  = parasail_memalign___m256i(32, segLen);
    pvHLoad   = parasail_memalign___m256i(32, segLen);
    pvHMStore = parasail_memalign___m256i(32, segLen);
    pvHMLoad  = parasail_memalign___m256i(32, segLen);
    pvHSStore = parasail_memalign___m256i(32, segLen);
    pvHSLoad  = parasail_memalign___m256i(32, segLen);
    pvHLStore = parasail_memalign___m256i(32, segLen);
    pvHLLoad  = parasail_memalign___m256i(32, segLen);
    pvE       = parasail_memalign___m256i(32, segLen);
    pvEM      = parasail_memalign___m256i(32, segLen);
    pvES      = parasail_memalign___m256i(32, segLen);
    pvEL      = parasail_memalign___m256i(32, segLen);
    boundary  = parasail_memalign_int64_t(32, s2Len+1);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvHMStore) return NULL;
    if (!pvHMLoad) return NULL;
    if (!pvHSStore) return NULL;
    if (!pvHSLoad) return NULL;
    if (!pvHLStore) return NULL;
    if (!pvHLLoad) return NULL;
    if (!pvE) return NULL;
    if (!pvEM) return NULL;
    if (!pvES) return NULL;
    if (!pvEL) return NULL;
    if (!boundary) return NULL;

    parasail_memset___m256i(pvHMStore, vZero, segLen);
    parasail_memset___m256i(pvHSStore, vZero, segLen);
    parasail_memset___m256i(pvHLStore, vZero, segLen);
    parasail_memset___m256i(pvEM, vZero, segLen);
    parasail_memset___m256i(pvES, vZero, segLen);
    parasail_memset___m256i(pvEL, vOne, segLen);

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m256i_64_t h;
            __m256i_64_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = -open-gap*(segNum*segLen+i);
                h.v[segNum] = tmp < INT64_MIN ? INT64_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT64_MIN ? INT64_MIN : tmp;
            }
            _mm256_store_si256(&pvHStore[index], h.m);
            _mm256_store_si256(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = -open-gap*(i-1);
            boundary[i] = tmp < INT64_MIN ? INT64_MIN : tmp;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m256i vEF_opn;
        __m256i vE;
        __m256i vE_ext;
        __m256i vEM;
        __m256i vES;
        __m256i vEL;
        __m256i vF;
        __m256i vF_ext;
        __m256i vFM;
        __m256i vFS;
        __m256i vFL;
        __m256i vH;
        __m256i vH_dag;
        __m256i vHM;
        __m256i vHS;
        __m256i vHL;
        const __m256i* vP = NULL;
        const __m256i* vPM = NULL;
        const __m256i* vPS = NULL;

        /* Initialize F value to neg inf.  Any errors to vH values will
         * be corrected in the Lazy_F loop.  */
        vF = vNegLimit;
        vFM = vZero;
        vFS = vZero;
        vFL = vOne;

        /* load final segment of pvHStore and shift left by 8 bytes */
        vH = _mm256_load_si256(&pvHStore[segLen - 1]);
        vHM = _mm256_load_si256(&pvHMStore[segLen - 1]);
        vHS = _mm256_load_si256(&pvHSStore[segLen - 1]);
        vHL = _mm256_load_si256(&pvHLStore[segLen - 1]);
        vH = _mm256_slli_si256_rpl(vH, 8);
        vHM = _mm256_slli_si256_rpl(vHM, 8);
        vHS = _mm256_slli_si256_rpl(vHS, 8);
        vHL = _mm256_slli_si256_rpl(vHL, 8);

        /* insert upper boundary condition */
        vH = _mm256_insert_epi64_rpl(vH, boundary[j], 0);

        /* Correct part of the vProfile */
        vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;
        vPM = vProfileM + matrix->mapper[(unsigned char)s2[j]] * segLen;
        vPS = vProfileS + matrix->mapper[(unsigned char)s2[j]] * segLen;

        /* Swap the 2 H buffers. */
        SWAP(pvHLoad,  pvHStore)
        SWAP(pvHMLoad, pvHMStore)
        SWAP(pvHSLoad, pvHSStore)
        SWAP(pvHLLoad, pvHLStore)

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            __m256i case1;
            __m256i case2;

            vE = _mm256_load_si256(pvE+ i);
            vEM = _mm256_load_si256(pvEM+ i);
            vES = _mm256_load_si256(pvES+ i);
            vEL = _mm256_load_si256(pvEL+ i);

            /* Get max from vH, vE and vF. */
            vH_dag = _mm256_add_epi64(vH, _mm256_load_si256(vP + i));
            vH = _mm256_max_epi64_rpl(vH_dag, vE);
            vH = _mm256_max_epi64_rpl(vH, vF);
            /* Save vH values. */
            _mm256_store_si256(pvHStore + i, vH);

            case1 = _mm256_cmpeq_epi64(vH, vH_dag);
            case2 = _mm256_cmpeq_epi64(vH, vF);

            /* calculate vM */
            vHM = _mm256_blendv_epi8(
                    _mm256_blendv_epi8(vEM, vFM, case2),
                    _mm256_add_epi64(vHM, _mm256_load_si256(vPM + i)),
                    case1);
            _mm256_store_si256(pvHMStore + i, vHM);

            /* calculate vS */
            vHS = _mm256_blendv_epi8(
                    _mm256_blendv_epi8(vES, vFS, case2),
                    _mm256_add_epi64(vHS, _mm256_load_si256(vPS + i)),
                    case1);
            _mm256_store_si256(pvHSStore + i, vHS);

            /* calculate vL */
            vHL = _mm256_blendv_epi8(
                    _mm256_blendv_epi8(vEL, vFL, case2),
                    _mm256_add_epi64(vHL, vOne),
                    case1);
            _mm256_store_si256(pvHLStore + i, vHL);

            vSaturationCheckMin = _mm256_min_epi64_rpl(vSaturationCheckMin, vH);
            vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vH);
            vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vHM);
            vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vHS);
            vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vHL);
#ifdef PARASAIL_TABLE
            arr_store_si256(result->stats->tables->matches_table, vHM, i, segLen, j, s2Len);
            arr_store_si256(result->stats->tables->similar_table, vHS, i, segLen, j, s2Len);
            arr_store_si256(result->stats->tables->length_table, vHL, i, segLen, j, s2Len);
            arr_store_si256(result->stats->tables->score_table, vH, i, segLen, j, s2Len);
#endif
            vEF_opn = _mm256_sub_epi64(vH, vGapO);

            /* Update vE value. */
            vE_ext = _mm256_sub_epi64(vE, vGapE);
            vE = _mm256_max_epi64_rpl(vEF_opn, vE_ext);
            case1 = _mm256_cmpgt_epi64(vEF_opn, vE_ext);
            vEM = _mm256_blendv_epi8(vEM, vHM, case1);
            vES = _mm256_blendv_epi8(vES, vHS, case1);
            vEL = _mm256_blendv_epi8(
                    _mm256_add_epi64(vEL, vOne),
                    _mm256_add_epi64(vHL, vOne),
                    case1);
            _mm256_store_si256(pvE + i, vE);
            _mm256_store_si256(pvEM + i, vEM);
            _mm256_store_si256(pvES + i, vES);
            _mm256_store_si256(pvEL + i, vEL);

            /* Update vF value. */
            vF_ext = _mm256_sub_epi64(vF, vGapE);
            vF = _mm256_max_epi64_rpl(vEF_opn, vF_ext);
            case1 = _mm256_cmpgt_epi64(vEF_opn, vF_ext);
            vFM = _mm256_blendv_epi8(vFM, vHM, case1);
            vFS = _mm256_blendv_epi8(vFS, vHS, case1);
            vFL = _mm256_blendv_epi8(
                    _mm256_add_epi64(vFL, vOne),
                    _mm256_add_epi64(vHL, vOne),
                    case1);

            /* Load the next vH. */
            vH = _mm256_load_si256(pvHLoad + i);
            vHM = _mm256_load_si256(pvHMLoad + i);
            vHS = _mm256_load_si256(pvHSLoad + i);
            vHL = _mm256_load_si256(pvHLLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            __m256i vHp = _mm256_load_si256(&pvHLoad[segLen - 1]);
            int64_t tmp = boundary[j+1]-open;
            int64_t tmp2 = tmp < INT64_MIN ? INT64_MIN : tmp;
            vHp = _mm256_slli_si256_rpl(vHp, 8);
            vF = _mm256_slli_si256_rpl(vF, 8);
            vFM = _mm256_slli_si256_rpl(vFM, 8);
            vFS = _mm256_slli_si256_rpl(vFS, 8);
            vFL = _mm256_slli_si256_rpl(vFL, 8);
            vHp = _mm256_insert_epi64_rpl(vHp, boundary[j], 0);
            vF = _mm256_insert_epi64_rpl(vF, tmp2, 0);
            vFL = _mm256_insert_epi64_rpl(vFL, 1, 0);
            for (i=0; i<segLen; ++i) {
                __m256i case1;
                __m256i case2;
                __m256i cond;

                vHp = _mm256_add_epi64(vHp, _mm256_load_si256(vP + i));
                vH = _mm256_load_si256(pvHStore + i);
                vH = _mm256_max_epi64_rpl(vH,vF);
                _mm256_store_si256(pvHStore + i, vH);
                case1 = _mm256_cmpeq_epi64(vH, vHp);
                case2 = _mm256_cmpeq_epi64(vH, vF);
                cond = _mm256_andnot_si256(case1, case2);

                /* calculate vM */
                vHM = _mm256_load_si256(pvHMStore + i);
                vHM = _mm256_blendv_epi8(vHM, vFM, cond);
                _mm256_store_si256(pvHMStore + i, vHM);

                /* calculate vS */
                vHS = _mm256_load_si256(pvHSStore + i);
                vHS = _mm256_blendv_epi8(vHS, vFS, cond);
                _mm256_store_si256(pvHSStore + i, vHS);

                /* calculate vL */
                vHL = _mm256_load_si256(pvHLStore + i);
                vHL = _mm256_blendv_epi8(vHL, vFL, cond);
                _mm256_store_si256(pvHLStore + i, vHL);

                vSaturationCheckMin = _mm256_min_epi64_rpl(vSaturationCheckMin, vH);
                vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vH);
                vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vHM);
                vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vHS);
                vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vHL);
#ifdef PARASAIL_TABLE
                arr_store_si256(result->stats->tables->matches_table, vHM, i, segLen, j, s2Len);
                arr_store_si256(result->stats->tables->similar_table, vHS, i, segLen, j, s2Len);
                arr_store_si256(result->stats->tables->length_table, vHL, i, segLen, j, s2Len);
                arr_store_si256(result->stats->tables->score_table, vH, i, segLen, j, s2Len);
#endif
                /* Update vF value. */
                vEF_opn = _mm256_sub_epi64(vH, vGapO);
                vF_ext = _mm256_sub_epi64(vF, vGapE);
                if (! _mm256_movemask_epi8(
                            _mm256_or_si256(
                                _mm256_cmpgt_epi64(vF_ext, vEF_opn),
                                _mm256_cmpeq_epi64(vF_ext, vEF_opn))))
                    goto end;
                /*vF = _mm256_max_epi64_rpl(vEF_opn, vF_ext);*/
                vF = vF_ext;
                cond = _mm256_cmpgt_epi64(vEF_opn, vF_ext);
                vFM = _mm256_blendv_epi8(vFM, vHM, cond);
                vFS = _mm256_blendv_epi8(vFS, vHS, cond);
                vFL = _mm256_blendv_epi8(
                        _mm256_add_epi64(vFL, vOne),
                        _mm256_add_epi64(vHL, vOne),
                        cond);
                vHp = _mm256_load_si256(pvHLoad + i);
            }
        }
end:
        {
        }

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm256_load_si256(pvHStore + offset);
            vHM = _mm256_load_si256(pvHMStore + offset);
            vHS = _mm256_load_si256(pvHSStore + offset);
            vHL = _mm256_load_si256(pvHLStore + offset);
            for (k=0; k<position; ++k) {
                vH = _mm256_slli_si256_rpl (vH, 8);
                vHM = _mm256_slli_si256_rpl (vHM, 8);
                vHS = _mm256_slli_si256_rpl (vHS, 8);
                vHL = _mm256_slli_si256_rpl (vHL, 8);
            }
            result->stats->rowcols->score_row[j] = (int64_t) _mm256_extract_epi64_rpl (vH, 3);
            result->stats->rowcols->matches_row[j] = (int64_t) _mm256_extract_epi64_rpl (vHM, 3);
            result->stats->rowcols->similar_row[j] = (int64_t) _mm256_extract_epi64_rpl (vHS, 3);
            result->stats->rowcols->length_row[j] = (int64_t) _mm256_extract_epi64_rpl (vHL, 3);
        }
#endif
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m256i vH = _mm256_load_si256(pvHStore+i);
        __m256i vHM = _mm256_load_si256(pvHMStore+i);
        __m256i vHS = _mm256_load_si256(pvHSStore+i);
        __m256i vHL = _mm256_load_si256(pvHLStore+i);
        arr_store_col(result->stats->rowcols->score_col, vH, i, segLen);
        arr_store_col(result->stats->rowcols->matches_col, vHM, i, segLen);
        arr_store_col(result->stats->rowcols->similar_col, vHS, i, segLen);
        arr_store_col(result->stats->rowcols->length_col, vHL, i, segLen);
    }
#endif

    /* extract last value from the last column */
    {
        __m256i vH = _mm256_load_si256(pvHStore + offset);
        __m256i vHM = _mm256_load_si256(pvHMStore + offset);
        __m256i vHS = _mm256_load_si256(pvHSStore + offset);
        __m256i vHL = _mm256_load_si256(pvHLStore + offset);
        for (k=0; k<position; ++k) {
            vH = _mm256_slli_si256_rpl (vH, 8);
            vHM = _mm256_slli_si256_rpl (vHM, 8);
            vHS = _mm256_slli_si256_rpl (vHS, 8);
            vHL = _mm256_slli_si256_rpl (vHL, 8);
        }
        score = (int64_t) _mm256_extract_epi64_rpl (vH, 3);
        matches = (int64_t) _mm256_extract_epi64_rpl (vHM, 3);
        similar = (int64_t) _mm256_extract_epi64_rpl (vHS, 3);
        length = (int64_t) _mm256_extract_epi64_rpl (vHL, 3);
    }

    if (_mm256_movemask_epi8(_mm256_or_si256(
            _mm256_cmplt_epi64_rpl(vSaturationCheckMin, vNegLimit),
            _mm256_cmpgt_epi64(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        matches = 0;
        similar = 0;
        length = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;
    result->stats->matches = matches;
    result->stats->similar = similar;
    result->stats->length = length;

    parasail_free(boundary);
    parasail_free(pvEL);
    parasail_free(pvES);
    parasail_free(pvEM);
    parasail_free(pvE);
    parasail_free(pvHLLoad);
    parasail_free(pvHLStore);
    parasail_free(pvHSLoad);
    parasail_free(pvHSStore);
    parasail_free(pvHMLoad);
    parasail_free(pvHMStore);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}